

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O2

ps_mgau_t * s2_semi_mgau_init(acmod_t *acmod)

{
  feat_t *pfVar1;
  uint32 *puVar2;
  ps_config_t *config;
  bool bVar3;
  size_t d2;
  char cVar4;
  int iVar5;
  int32 iVar6;
  uint uVar7;
  ps_mgau_t *ps;
  logmath_t *plVar8;
  char *pcVar9;
  char *pcVar10;
  gauden_t *pgVar11;
  FILE *__stream;
  size_t sVar12;
  FILE *pFVar13;
  float32 *vec;
  char *pcVar14;
  mmio_file_t *mf;
  void *pvVar15;
  ps_mgaufuncs_t *ppVar16;
  ulong uVar17;
  int j;
  ulong uVar18;
  long lVar19;
  FILE *pFVar20;
  ushort uVar21;
  long lVar22;
  ulong uVar23;
  uint32 *puVar24;
  ulong uVar25;
  undefined1 uVar26;
  uint uVar27;
  FILE *pFVar28;
  long lVar29;
  size_t sVar30;
  ulong uVar31;
  float64 base;
  double dVar32;
  undefined8 in_stack_fffffffffffffb58;
  undefined4 uVar33;
  uint local_484;
  int32 r;
  uint local_47c;
  int local_478;
  uint32 chksum;
  FILE *local_470;
  char *local_468;
  double local_460;
  char **argval;
  int32 n_sen;
  int32 n_feat;
  char eofchk;
  ulong local_440;
  float64 local_438;
  ulong local_430;
  size_t local_428;
  int32 n;
  char line [1000];
  
  ps = (ps_mgau_t *)
       __ckd_calloc__(1,0x80,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                      ,0x4d5);
  ps[1].vt = (ps_mgaufuncs_t *)acmod->config;
  plVar8 = logmath_retain(acmod->lmath);
  *(logmath_t **)&ps[7].frame_idx = plVar8;
  base = logmath_get_base(acmod->lmath);
  plVar8 = logmath_init(base,10,1);
  ps[7].vt = (ps_mgaufuncs_t *)plVar8;
  if (plVar8 == (logmath_t *)0x0) goto LAB_0013cbc1;
  iVar5 = logmath_get_width(plVar8);
  if (iVar5 != 1) {
    logmath_get_base((logmath_t *)ps[7].vt);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x4e0,"Log base %f is too small to represent add table in 8 bits\n");
    goto LAB_0013cbc1;
  }
  pcVar9 = ps_config_str((cmd_ln_t *)ps[1].vt,"mean");
  pcVar10 = ps_config_str((cmd_ln_t *)ps[1].vt,"var");
  dVar32 = ps_config_float((ps_config_t *)ps[1].vt,"varfloor");
  pgVar11 = gauden_init(pcVar9,pcVar10,(float32)(float)dVar32,*(logmath_t **)&ps[7].frame_idx);
  *(gauden_t **)&ps[1].frame_idx = pgVar11;
  if (pgVar11 == (gauden_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x4e9,"Failed to read means and variances\n");
    goto LAB_0013cbc1;
  }
  if (pgVar11->n_mgau != 1) goto LAB_0013cbc1;
  uVar7 = pgVar11->n_feat;
  pfVar1 = acmod->fcb;
  uVar27 = pfVar1->n_sv;
  if (uVar27 == 0) {
    uVar27 = pfVar1->n_stream;
  }
  if (uVar7 != uVar27) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x4f6,"Number of streams does not match: %d != %d\n",(ulong)uVar7);
    goto LAB_0013cbc1;
  }
  puVar24 = &pfVar1->out_dim;
  lVar22 = 0;
  uVar25 = 0;
  if (0 < (int)uVar7) {
    uVar25 = (ulong)uVar7;
  }
  uVar31 = 0;
  for (; uVar25 * 4 - lVar22 != 0; lVar22 = lVar22 + 4) {
    uVar27 = *(uint *)((long)pgVar11->featlen + lVar22);
    if (pfVar1->lda == (mfcc_t ***)0x0) {
      puVar2 = pfVar1->sv_len;
      if (puVar2 == (uint32 *)0x0) {
        if (uVar27 != *(uint *)((long)pfVar1->stream_len + lVar22)) {
          puVar24 = (uint32 *)(lVar22 + (long)pfVar1->stream_len);
          goto LAB_0013c9cd;
        }
      }
      else if (uVar27 != *(uint *)((long)puVar2 + lVar22)) {
        puVar24 = (uint32 *)((long)puVar2 + lVar22);
LAB_0013c9cd:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x4fc,"Dimension of stream %d does not match: %d != %d\n",uVar31,(ulong)uVar27,
                CONCAT44((int)((ulong)in_stack_fffffffffffffb58 >> 0x20),*puVar24));
        goto LAB_0013cbc1;
      }
    }
    else if (uVar27 != *puVar24) goto LAB_0013c9cd;
    uVar31 = (ulong)((int)uVar31 + 1);
  }
  local_428 = (long)(int)uVar7;
  pcVar9 = ps_config_str((cmd_ln_t *)ps[1].vt,"sendump");
  if (pcVar9 == (char *)0x0) {
    pcVar9 = ps_config_str((cmd_ln_t *)ps[1].vt,"mixw");
    local_460 = ps_config_float((ps_config_t *)ps[1].vt,"mixwfloor");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x44c,"Reading mixture weights file \'%s\'\n",pcVar9);
    local_468 = pcVar9;
    pFVar13 = fopen(pcVar9,"rb");
    if (pFVar13 == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                     ,0x44f,"Failed to open mixture weights file \'%s\' for reading",local_468);
      goto LAB_0013cefa;
    }
    local_470 = pFVar13;
    local_440 = uVar25;
    iVar6 = bio_readhdr((FILE *)pFVar13,(char ***)line,&argval,&r);
    if (iVar6 < 0) {
      pcVar9 = "Failed to read header from file \'%s\'\n";
      lVar22 = 0x453;
    }
    else {
      bVar3 = false;
      for (uVar25 = 0; pcVar9 = *(char **)(line._0_8_ + uVar25 * 8), pcVar9 != (char *)0x0;
          uVar25 = uVar25 + 1) {
        iVar5 = strcmp(pcVar9,"version");
        if (iVar5 == 0) {
          pcVar9 = argval[uVar25];
          iVar5 = strcmp(pcVar9,"1.0");
          if (iVar5 != 0) {
            in_stack_fffffffffffffb58 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                    ,0x45b,"Version mismatch(%s): %s, expecting %s\n",local_468,pcVar9,"1.0");
          }
        }
        else {
          iVar5 = strcmp(pcVar9,"chksum0");
          if (iVar5 == 0) {
            bVar3 = true;
          }
        }
      }
      bio_hdrarg_free((char **)line._0_8_,argval);
      pFVar13 = local_470;
      argval = (char **)0x0;
      line[0] = '\0';
      line[1] = '\0';
      line[2] = '\0';
      line[3] = '\0';
      line[4] = '\0';
      line[5] = '\0';
      line[6] = '\0';
      line[7] = '\0';
      chksum = 0;
      iVar6 = bio_fread(&n_sen,4,1,(FILE *)local_470,r,&chksum);
      if ((((iVar6 == 1) && (iVar6 = bio_fread(&n_feat,4,1,(FILE *)pFVar13,r,&chksum), iVar6 == 1))
          && (iVar6 = bio_fread(&local_478,4,1,(FILE *)pFVar13,r,&chksum), iVar6 == 1)) &&
         (iVar6 = bio_fread(&n,4,1,(FILE *)pFVar13,r,&chksum), iVar6 == 1)) {
        if (n_feat != *(int *)(*(long *)&ps[1].frame_idx + 0x24)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x470,"#Features streams(%d) != %d\n");
          goto LAB_0013cefa;
        }
        if (n != n_sen * n_feat * local_478) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x474,"%s: #float32s(%d) doesn\'t match header dimensions: %d x %d x %d\n",
                  local_468,uVar25 & 0xffffffff,
                  CONCAT44((int)((ulong)in_stack_fffffffffffffb58 >> 0x20),n_sen),n_feat,local_478);
          goto LAB_0013cefa;
        }
        ps[3].frame_idx = n_sen;
        ppVar16 = (ps_mgaufuncs_t *)
                  __ckd_calloc_3d__((long)n_feat,(long)*(int *)(*(long *)&ps[1].frame_idx + 0x28),
                                    (long)n_sen,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                    ,0x47d);
        ps[2].vt = ppVar16;
        vec = (float32 *)
              __ckd_calloc__((long)local_478,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                             ,0x480);
        uVar7 = 0;
        for (lVar22 = 0; uVar33 = (undefined4)((ulong)in_stack_fffffffffffffb58 >> 0x20),
            lVar22 < n_sen; lVar22 = lVar22 + 1) {
          for (lVar29 = 0; lVar29 < n_feat; lVar29 = lVar29 + 1) {
            local_47c = uVar7;
            iVar6 = bio_fread(vec,4,local_478,(FILE *)pFVar13,r,&chksum);
            if (iVar6 != local_478) {
              pcVar9 = "bio_fread(%s) (arraydata) failed\n";
              lVar22 = 0x488;
              goto LAB_0013ceee;
            }
            local_438 = vector_sum_norm(vec,iVar6);
            vector_floor(vec,local_478,(float64)local_460);
            vector_sum_norm(vec,local_478);
            for (lVar19 = 0; lVar19 < local_478; lVar19 = lVar19 + 1) {
              iVar5 = logmath_log((logmath_t *)ps[7].vt,(float64)(double)(float)vec[lVar19]);
              cVar4 = -(char)iVar5;
              if (iVar5 - 1U < 0xffffff60) {
                cVar4 = -0x61;
              }
              *(char *)(*(long *)((&(ps[2].vt)->name)[lVar29] + lVar19 * 8) + lVar22) = cVar4;
            }
            uVar7 = (local_47c + 1) - (uint)(0.0 < (double)local_438);
            pFVar13 = local_470;
          }
        }
        if (0 < (int)uVar7) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x49d,"Weight normalization failed for %d mixture weights components\n");
        }
        ckd_free(vec);
        if (bVar3) {
          bio_verify_chksum((FILE *)pFVar13,r,chksum);
        }
        sVar12 = fread(&eofchk,1,1,pFVar13);
        if (sVar12 != 1) {
          fclose(pFVar13);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x4a9,"Read %d x %d x %d mixture weights\n",(ulong)(uint)n_sen,
                  (ulong)(uint)n_feat,CONCAT44(uVar33,local_478));
          if (-1 < n_sen) {
LAB_0013c871:
            lVar22 = ps_config_int((cmd_ln_t *)ps[1].vt,"ds");
            *(short *)((long)&ps[4].frame_idx + 2) = (short)lVar22;
            ppVar16 = (ps_mgaufuncs_t *)
                      __ckd_calloc__(local_428,1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                     ,0x50f);
            ps[4].vt = ppVar16;
            lVar22 = ps_config_int((cmd_ln_t *)ps[1].vt,"topn");
            *(short *)&ps[4].frame_idx = (short)lVar22;
            pcVar9 = ps_config_str((cmd_ln_t *)ps[1].vt,"topn_beam");
            ppVar16 = ps[4].vt;
            pcVar10 = __ckd_salloc__(pcVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                     ,0x4b1);
            uVar25 = 0;
            uVar7 = 0;
            pcVar9 = pcVar10;
            do {
              uVar26 = (undefined1)uVar7;
              uVar31 = local_440;
              if (local_440 == uVar25) {
LAB_0013ca1f:
                for (lVar22 = (long)(int)uVar31; lVar22 < (long)local_428; lVar22 = lVar22 + 1) {
                  *(undefined1 *)((long)&ppVar16->name + lVar22) = uVar26;
                }
                ckd_free(pcVar10);
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                        ,0x512,"Maximum top-N: %d ",(ulong)(uint)(int)(short)ps[4].frame_idx);
                err_msg(ERR_INFO,(char *)0x0,0,"Top-N beams:");
                uVar25 = local_440;
                for (uVar31 = 0; uVar25 != uVar31; uVar31 = uVar31 + 1) {
                  err_msg(ERR_INFO,(char *)0x0,0," %d",
                          (ulong)*(byte *)((long)&(ps[4].vt)->name + uVar31));
                }
                err_msg(ERR_INFO,(char *)0x0,0,"\n");
                lVar22 = ps_config_int((cmd_ln_t *)ps[1].vt,"pl_window");
                d2 = local_428;
                iVar5 = (int)lVar22 + 2;
                ps[6].frame_idx = iVar5;
                ppVar16 = (ps_mgaufuncs_t *)
                          __ckd_calloc_3d__((long)iVar5,local_428,(long)(short)ps[4].frame_idx,8,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                            ,0x51d);
                ps[5].vt = ppVar16;
                pvVar15 = __ckd_calloc_2d__((long)ps[6].frame_idx,d2,1,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                            ,0x51f);
                *(void **)&ps[5].frame_idx = pvVar15;
                uVar31 = (ulong)(uint)ps[6].frame_idx;
                if (ps[6].frame_idx < 1) {
                  uVar31 = 0;
                }
                for (uVar17 = 0; uVar17 != uVar31; uVar17 = uVar17 + 1) {
                  for (uVar18 = 0; uVar18 != uVar25; uVar18 = uVar18 + 1) {
                    uVar21 = (ushort)ps[4].frame_idx;
                    if ((short)uVar21 < 1) {
                      uVar21 = 0;
                    }
                    for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
                      lVar22 = *(long *)((&(ps[5].vt)->name)[uVar17] + uVar18 * 8);
                      *(undefined4 *)(lVar22 + uVar23 * 8) = 0x80000000;
                      *(int *)(lVar22 + 4 + uVar23 * 8) = (int)uVar23;
                    }
                  }
                }
                ps->vt = &s2_semi_mgau_funcs;
                return ps;
              }
              pcVar14 = strchr(pcVar9,0x2c);
              if (pcVar14 == (char *)0x0) {
                uVar31 = uVar25;
                if (*pcVar9 != '\0') {
                  uVar27 = atoi(pcVar9);
                  *(char *)((long)&ppVar16->name + uVar25) = (char)uVar27;
                  if (uVar7 < (uVar27 & 0xff)) {
                    uVar26 = (char)uVar27;
                  }
                  uVar31 = (ulong)((int)uVar25 + 1);
                }
                goto LAB_0013ca1f;
              }
              *pcVar14 = '\0';
              uVar27 = atoi(pcVar9);
              if (uVar7 < (uVar27 & 0xff)) {
                uVar7 = uVar27 & 0xff;
              }
              *(char *)((long)&ppVar16->name + uVar25) = (char)uVar27;
              pcVar9 = pcVar14 + 1;
              uVar25 = uVar25 + 1;
            } while( true );
          }
          goto LAB_0013cbc1;
        }
        pcVar9 = "More data than expected in %s\n";
        lVar22 = 0x4a5;
      }
      else {
        pcVar9 = "bio_fread(%s) (arraysize) failed\n";
        lVar22 = 0x46d;
      }
    }
LAB_0013ceee:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,lVar22,pcVar9,local_468);
LAB_0013cefa:
    exit(1);
  }
  config = (ps_config_t *)ps[1].vt;
  pFVar28 = (FILE *)(ulong)*(uint *)(*(long *)&ps[1].frame_idx + 0x24);
  local_47c = *(uint *)(*(long *)&ps[1].frame_idx + 0x28);
  uVar7 = acmod->mdef->n_sen;
  pFVar13 = (FILE *)(ulong)uVar7;
  ps[3].frame_idx = uVar7;
  iVar5 = ps_config_bool(config,"mmap");
  local_438 = (float64)CONCAT44(local_438._4_4_,iVar5);
  __stream = fopen(pcVar9,"rb");
  if (__stream == (FILE *)0x0) goto LAB_0013cbc1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,0x389,"Loading senones from dump file %s\n",pcVar9);
  sVar12 = fread(&argval,4,1,__stream);
  if (sVar12 == 1) {
    uVar7 = (uint)argval - 1;
    uVar27 = (uint)argval;
    local_470 = pFVar28;
    if (uVar7 < 999) {
LAB_0013c962:
      local_460 = (double)CONCAT44(local_460._4_4_,uVar7);
      local_440 = uVar25;
      sVar12 = fread(line,1,(ulong)uVar27,__stream);
      if (sVar12 == uVar27) {
        if (line[uVar27 - 1] == '\0') {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x3a1,"%s\n",line);
          sVar12 = fread(&argval,4,1,__stream);
          if (sVar12 == 1) {
            uVar7 = (uint)argval;
            if (0x3e6 < local_460._0_4_) {
              uVar7 = (uint)argval >> 0x18 | ((uint)argval & 0xff0000) >> 8 |
                      ((uint)argval & 0xff00) << 8 | (uint)argval << 0x18;
              argval = (char **)CONCAT44(argval._4_4_,uVar7);
            }
            sVar30 = (size_t)(int)uVar7;
            sVar12 = fread(line,1,sVar30,__stream);
            if (sVar12 == sVar30) {
              if (line[sVar30 - 1] == '\0') {
                local_468 = (char *)CONCAT44(local_468._4_4_,8);
                local_484 = 0;
                pFVar28 = local_470;
LAB_0013ccdb:
                uVar7 = (uint)pFVar13;
                sVar12 = fread(&argval,4,1,__stream);
                if (sVar12 == 1) {
                  uVar27 = (uint)argval;
                  if (0x3e6 < local_460._0_4_) {
                    uVar27 = (uint)argval >> 0x18 | ((uint)argval & 0xff0000) >> 8 |
                             ((uint)argval & 0xff00) << 8 | (uint)argval << 0x18;
                    argval = (char **)CONCAT44(argval._4_4_,uVar27);
                  }
                  local_470 = pFVar28;
                  if (uVar27 != 0) {
                    sVar12 = fread(line,1,(long)(int)uVar27,__stream);
                    if (sVar12 == (long)(int)uVar27) goto code_r0x0013cd40;
                    pcVar9 = "Cannot read header";
                    lVar22 = 0x3bc;
                    goto LAB_0013cbad;
                  }
                  local_430 = (ulong)local_47c;
                  r = local_47c;
                  uVar27 = uVar7;
                  chksum = uVar7;
                  if (local_484 == 0) {
                    sVar12 = fread(&r,4,1,__stream);
                    if (sVar12 != 1) {
                      pcVar9 = "Cannot read #rows";
                      lVar22 = 0x3d7;
                      goto LAB_0013cbad;
                    }
                    if (0x3e6 < local_460._0_4_) {
                      r = (uint)r >> 0x18 | (r & 0xff0000U) >> 8 | (r & 0xff00U) << 8 | r << 0x18;
                    }
                    sVar12 = fread(&chksum,4,1,__stream);
                    if (sVar12 != 1) {
                      pcVar9 = "Cannot read #columns";
                      lVar22 = 0x3dc;
                      goto LAB_0013cbad;
                    }
                    uVar27 = chksum >> 0x18 | (chksum & 0xff0000) >> 8 | (chksum & 0xff00) << 8 |
                             chksum << 0x18;
                    if (local_460._0_4_ < 999) {
                      uVar27 = chksum;
                    }
                    local_430 = (ulong)(uint)r;
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,0x3e0,"Rows: %d, Columns: %d\n");
                  }
                  if ((int)local_470 == *(int *)(*(long *)&ps[1].frame_idx + 0x24)) {
                    if (local_47c != *(uint *)(*(long *)&ps[1].frame_idx + 0x28)) {
                      pcVar9 = "Number of densities mismatch: %d != %d\n";
                      lVar22 = 0x3ea;
                      pFVar13 = (FILE *)(ulong)local_47c;
                      goto LAB_0013d01e;
                    }
                    if (uVar7 != ps[3].frame_idx) {
                      pcVar9 = "Number of senones mismatch: %d != %d\n";
                      lVar22 = 0x3ef;
                      goto LAB_0013d01e;
                    }
                    if (local_484 == 0) {
LAB_0013d031:
                      if (((int)local_468 != 4) && ((int)local_468 != 8)) {
                        pcVar9 = "Cluster count must be 4 or 8\n";
                        lVar22 = 0x3fb;
                        goto LAB_0013d0d1;
                      }
                      if (local_438._0_4_ != 0) {
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                ,0x400,"Using memory-mapped I/O for senones\n");
                      }
                      local_460 = (double)ftell(__stream);
                      uVar25 = (ulong)local_484;
                      if (local_438._0_4_ != 0) {
                        mf = mmio_file_read(pcVar9);
                        *(mmio_file_t **)&ps[2].frame_idx = mf;
                        if (local_484 != 0) {
                          pvVar15 = mmio_file_ptr(mf);
                          ps[3].vt = (ps_mgaufuncs_t *)((long)pvVar15 + (long)local_460);
                          local_460 = (double)((long)local_460 + uVar25);
                        }
LAB_0013d122:
                        if (*(long *)&ps[2].frame_idx == 0) {
                          ppVar16 = (ps_mgaufuncs_t *)
                                    __ckd_calloc_3d__((long)(int)local_470,(long)(int)local_47c,
                                                      (long)(int)uVar7,1,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                                  ,0x426);
                          pFVar28 = (FILE *)0x0;
                          pFVar13 = (FILE *)(local_430 & 0xffffffff);
                          if ((int)local_430 < 1) {
                            pFVar13 = pFVar28;
                          }
                          iVar5 = (int)local_470;
                          local_470 = (FILE *)((ulong)local_470 & 0xffffffff);
                          if (iVar5 < 1) {
                            local_470 = pFVar28;
                          }
                          ps[2].vt = ppVar16;
                          local_47c = (int)(uVar27 + 1) / 2;
                          if ((int)local_468 != 4) {
                            local_47c = uVar27;
                          }
                          sVar12 = (size_t)(int)local_47c;
                          for (; pFVar28 != local_470;
                              pFVar28 = (FILE *)((long)&pFVar28->_flags + 1)) {
                            pFVar20 = (FILE *)0x0;
                            while (pFVar13 != pFVar20) {
                              sVar30 = fread(*(void **)((&(ps[2].vt)->name)[(long)pFVar28] +
                                                       (long)pFVar20 * 8),1,sVar12,__stream);
                              pFVar20 = (FILE *)((long)&pFVar20->_flags + 1);
                              if (sVar30 != sVar12) {
                                lVar22 = 0x42f;
                                local_484 = local_47c;
                                goto LAB_0013d2c4;
                              }
                            }
                          }
                        }
                        else {
                          ppVar16 = (ps_mgaufuncs_t *)
                                    __ckd_calloc_2d__((long)(int)local_470,(long)(int)local_47c,8,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                                  ,0x41a);
                          pFVar28 = (FILE *)0x0;
                          pFVar13 = (FILE *)(local_430 & 0xffffffff);
                          if ((int)local_430 < 1) {
                            pFVar13 = pFVar28;
                          }
                          iVar5 = (int)local_470;
                          local_470 = (FILE *)((ulong)local_470 & 0xffffffff);
                          if (iVar5 < 1) {
                            local_470 = pFVar28;
                          }
                          ps[2].vt = ppVar16;
                          uVar7 = (int)(uVar27 + 1) / 2;
                          if ((int)local_468 != 4) {
                            uVar7 = uVar27;
                          }
                          for (; pFVar28 != local_470;
                              pFVar28 = (FILE *)((long)&pFVar28->_flags + 1)) {
                            for (pFVar20 = (FILE *)0x0; pFVar13 != pFVar20;
                                pFVar20 = (FILE *)((long)&pFVar20->_flags + 1)) {
                              pvVar15 = mmio_file_ptr(*(mmio_file_t **)&ps[2].frame_idx);
                              *(long *)((&(ps[2].vt)->name)[(long)pFVar28] + (long)pFVar20 * 8) =
                                   (long)pvVar15 + (long)local_460;
                              local_460 = (double)((long)local_460 + (long)(int)uVar7);
                            }
                          }
                        }
                        fclose(__stream);
                        goto LAB_0013c871;
                      }
                      if (local_484 == 0) goto LAB_0013d122;
                      ppVar16 = (ps_mgaufuncs_t *)
                                __ckd_calloc__(1,uVar25,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                               ,0x410);
                      ps[3].vt = ppVar16;
                      sVar12 = fread(ppVar16,1,uVar25,__stream);
                      if (sVar12 == uVar25) goto LAB_0013d122;
                      lVar22 = 0x412;
LAB_0013d2c4:
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                              ,lVar22,"Failed to read %d bytes from sendump\n",(ulong)local_484);
                    }
                    else {
                      if (local_484 == 0xf) {
                        local_484 = 0x10;
                        goto LAB_0013d031;
                      }
                      if (local_484 == 0x10) goto LAB_0013d031;
                      pcVar9 = "Cluster count must be 0, 15, or 16\n";
                      lVar22 = 0x3f4;
LAB_0013d0d1:
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                              ,lVar22,pcVar9);
                    }
                  }
                  else {
                    pcVar9 = "Number of feature streams mismatch: %d != %d\n";
                    lVar22 = 0x3e5;
                    pFVar13 = local_470;
LAB_0013d01e:
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                            ,lVar22,pcVar9,pFVar13);
                  }
                  goto LAB_0013cbb9;
                }
                pcVar10 = "Failed to read header string size from %s";
                lVar22 = 0x3b5;
                goto LAB_0013c953;
              }
              pcVar9 = "Bad header in dump file\n";
              lVar22 = 0x3ae;
              goto LAB_0013c9ba;
            }
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                           ,0x3aa,"Cannot read header");
          }
          else {
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                           ,0x3a5,"Failed to read header size from %s",pcVar9);
          }
        }
        else {
          pcVar9 = "Bad title in dump file\n";
          lVar22 = 0x39e;
LAB_0013c9ba:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,lVar22,pcVar9);
        }
      }
      else {
        pcVar9 = "Cannot read title";
        lVar22 = 0x39a;
LAB_0013cbad:
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                       ,lVar22,pcVar9);
      }
    }
    else {
      uVar27 = (uint)argval >> 0x18 | ((uint)argval & 0xff0000) >> 8 | ((uint)argval & 0xff00) << 8
               | (uint)argval << 0x18;
      argval = (char **)CONCAT44(argval._4_4_,uVar27);
      if (0xfffffc18 < uVar27 - 1000) goto LAB_0013c962;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
              ,0x394,"Title length %x in dump file %s out of range\n",(ulong)uVar27,pcVar9);
    }
  }
  else {
    pcVar10 = "Failed to read title size from %s";
    lVar22 = 0x38c;
LAB_0013c953:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                   ,lVar22,pcVar10,pcVar9);
  }
LAB_0013cbb9:
  fclose(__stream);
LAB_0013cbc1:
  s2_semi_mgau_free(ps);
  return (ps_mgau_t *)0x0;
code_r0x0013cd40:
  iVar5 = bcmp(line,"feature_count ",0xe);
  pFVar28 = local_470;
  if (iVar5 == 0) {
    uVar7 = atoi(line + 0xe);
    pFVar28 = (FILE *)(ulong)uVar7;
  }
  iVar5 = bcmp(line,"mixture_count ",0xe);
  if (iVar5 == 0) {
    local_47c = atoi(line + 0xe);
  }
  iVar5 = bcmp(line,"model_count ",0xc);
  if (iVar5 == 0) {
    uVar7 = atoi(line + 0xc);
    pFVar13 = (FILE *)(ulong)uVar7;
  }
  iVar5 = bcmp(line,"cluster_count ",0xe);
  if (iVar5 == 0) {
    local_484 = atoi(line + 0xe);
  }
  iVar5 = bcmp(line,"cluster_bits ",0xd);
  if (iVar5 == 0) {
    iVar5 = atoi(line + 0xd);
    local_468 = (char *)CONCAT44(local_468._4_4_,iVar5);
  }
  goto LAB_0013ccdb;
}

Assistant:

ps_mgau_t *
s2_semi_mgau_init(acmod_t *acmod)
{
    s2_semi_mgau_t *s;
    ps_mgau_t *ps;
    char const *sendump_path;
    int i;
    int n_feat;

    s = ckd_calloc(1, sizeof(*s));
    s->config = acmod->config;

    s->lmath = logmath_retain(acmod->lmath);
    /* Log-add table. */
    s->lmath_8b = logmath_init(logmath_get_base(acmod->lmath), SENSCR_SHIFT, TRUE);
    if (s->lmath_8b == NULL)
        goto error_out;
    /* Ensure that it is only 8 bits wide so that fast_logmath_add() works. */
    if (logmath_get_width(s->lmath_8b) != 1) {
        E_ERROR("Log base %f is too small to represent add table in 8 bits\n",
                logmath_get_base(s->lmath_8b));
        goto error_out;
    }

    /* Read means and variances. */
    if ((s->g = gauden_init(ps_config_str(s->config, "mean"),
                            ps_config_str(s->config, "var"),
                            ps_config_float(s->config, "varfloor"),
                            s->lmath)) == NULL) {
        E_ERROR("Failed to read means and variances\n");	
        goto error_out;
    }

    /* Currently only a single codebook is supported. */
    if (s->g->n_mgau != 1)
        goto error_out;

    n_feat = s->g->n_feat;

    /* Verify n_feat and veclen, against acmod. */
    if (n_feat != feat_dimension1(acmod->fcb)) {
        E_ERROR("Number of streams does not match: %d != %d\n",
                n_feat, feat_dimension1(acmod->fcb));
        goto error_out;
    }
    for (i = 0; i < n_feat; ++i) {
        if ((uint32)s->g->featlen[i] != feat_dimension2(acmod->fcb, i)) {
            E_ERROR("Dimension of stream %d does not match: %d != %d\n",
                    i, s->g->featlen[i], feat_dimension2(acmod->fcb, i));
            goto error_out;
        }
    }
    /* Read mixture weights */
    if ((sendump_path = ps_config_str(s->config, "sendump"))) {
        if (read_sendump(s, acmod->mdef, sendump_path) < 0) {
            goto error_out;
        }
    }
    else {
        if (read_mixw(s, ps_config_str(s->config, "mixw"),
                      ps_config_float(s->config, "mixwfloor")) < 0) {
            goto error_out;
        }
    }
    s->ds_ratio = ps_config_int(s->config, "ds");

    /* Determine top-N for each feature */
    s->topn_beam = ckd_calloc(n_feat, sizeof(*s->topn_beam));
    s->max_topn = ps_config_int(s->config, "topn");
    split_topn(ps_config_str(s->config, "topn_beam"), s->topn_beam, n_feat);
    E_INFO("Maximum top-N: %d ", s->max_topn);
    E_INFOCONT("Top-N beams:");
    for (i = 0; i < n_feat; ++i) {
        E_INFOCONT(" %d", s->topn_beam[i]);
    }
    E_INFOCONT("\n");

    /* Top-N scores from recent frames */
    s->n_topn_hist = ps_config_int(s->config, "pl_window") + 2;
    s->topn_hist = (vqFeature_t ***)
        ckd_calloc_3d(s->n_topn_hist, n_feat, s->max_topn,
                      sizeof(***s->topn_hist));
    s->topn_hist_n = ckd_calloc_2d(s->n_topn_hist, n_feat,
                                   sizeof(**s->topn_hist_n));
    for (i = 0; i < s->n_topn_hist; ++i) {
        int j;
        for (j = 0; j < n_feat; ++j) {
            int k;
            for (k = 0; k < s->max_topn; ++k) {
                s->topn_hist[i][j][k].score = WORST_DIST;
                s->topn_hist[i][j][k].codeword = k;
            }
        }
    }

    ps = (ps_mgau_t *)s;
    ps->vt = &s2_semi_mgau_funcs;
    return ps;
error_out:
    s2_semi_mgau_free(ps_mgau_base(s));
    return NULL;
}